

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.cc
# Opt level: O1

void __thiscall kratos::HashVisitor::visit(HashVisitor *this,CombinationalStmtBlock *param_1)

{
  iterator __position;
  unsigned_long local_10;
  
  local_10 = -0xe44323405ac1f4c << ((byte)(this->super_IRVisitor).level & 0x3f);
  __position._M_current =
       (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_realloc_insert<unsigned_long>
              (&this->stmt_hashes_,__position,&local_10);
  }
  else {
    *__position._M_current = local_10;
    (this->stmt_hashes_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = __position._M_current + 1;
  }
  return;
}

Assistant:

void visit(CombinationalStmtBlock*) override {
        constexpr uint64_t comb_signature = shift_const(0x9e3779b97f4a7c16, 3);
        stmt_hashes_.emplace_back(comb_signature << level);
    }